

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O1

void __thiscall HACD::HACD::CreateGraph(HACD *this)

{
  Graph *this_00;
  _Rb_tree_header *p_Var1;
  Vec3<long> *pVVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Vec3<double> *pVVar6;
  double dVar7;
  int i;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  pointer psVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  vertexToTriangles;
  unsigned_long_long tr2 [3];
  unsigned_long_long tr1 [3];
  char msg [1024];
  double local_4e0;
  long local_4d8;
  ulong local_4d0;
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  local_4b8;
  long local_498;
  long local_490;
  _Rb_tree_node_base *local_488;
  double local_480;
  long local_478 [4];
  long local_458 [4];
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  local_438 [43];
  undefined1 extraout_var [56];
  
  local_4b8.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::resize(&local_4b8,this->m_nPoints);
  if (this->m_nTriangles != 0) {
    lVar18 = 0;
    psVar16 = (pointer)0x0;
    do {
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                (&local_4b8.
                  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(long *)((long)this->m_triangles->m_data + lVar18)]._M_t,(long *)local_438);
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                (&local_4b8.
                  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(long *)((long)this->m_triangles->m_data + lVar18 + 8)]._M_t,(long *)local_438);
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar16;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>
                (&local_4b8.
                  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(long *)((long)this->m_triangles->m_data + lVar18 + 0x10)]._M_t,
                 (long *)local_438);
      psVar16 = (pointer)&(psVar16->_M_t)._M_impl.field_0x1;
      lVar18 = lVar18 + 0x18;
    } while (psVar16 < (undefined1 *)this->m_nTriangles);
  }
  this_00 = &this->m_graph;
  Graph::Clear(this_00);
  Graph::Allocate(this_00,this->m_nTriangles,this->m_nTriangles * 5);
  if (this->m_nPoints != 0) {
    uVar14 = 0;
    do {
      p_Var1 = &local_4b8.
                super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t._M_impl.super__Rb_tree_header
      ;
      for (p_Var10 = (p_Var1->_M_header)._M_left; (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        lVar18 = *(long *)(p_Var10 + 1);
        pVVar2 = this->m_triangles;
        uVar3 = pVVar2[lVar18].m_data[0];
        uVar4 = pVVar2[lVar18].m_data[1];
        uVar5 = pVVar2[lVar18].m_data[2];
        local_458[0] = (uVar4 << 0x20) + uVar3;
        if (uVar4 < uVar3) {
          local_458[0] = (uVar3 << 0x20) + uVar4;
        }
        local_458[1] = (uVar5 << 0x20) + uVar4;
        if (uVar5 < uVar4) {
          local_458[1] = (uVar4 << 0x20) + uVar5;
        }
        local_458[2] = (uVar3 << 0x20) + uVar5;
        if (uVar3 < uVar5) {
          local_458[2] = (uVar5 << 0x20) + uVar3;
        }
        for (p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
            (_Rb_tree_header *)p_Var8 != p_Var1;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          lVar17 = *(long *)(p_Var8 + 1);
          pVVar2 = this->m_triangles;
          uVar3 = pVVar2[lVar17].m_data[0];
          uVar4 = pVVar2[lVar17].m_data[1];
          uVar5 = pVVar2[lVar17].m_data[2];
          local_478[0] = (uVar4 << 0x20) + uVar3;
          if (uVar4 < uVar3) {
            local_478[0] = (uVar3 << 0x20) + uVar4;
          }
          local_478[1] = (uVar5 << 0x20) + uVar4;
          if (uVar5 < uVar4) {
            local_478[1] = (uVar4 << 0x20) + uVar5;
          }
          local_478[2] = (uVar3 << 0x20) + uVar5;
          if (uVar3 < uVar5) {
            local_478[2] = (uVar5 << 0x20) + uVar3;
          }
          lVar9 = 0;
          iVar13 = 0;
          do {
            lVar15 = 0;
            do {
              iVar13 = iVar13 + (uint)(local_458[lVar9] == local_478[lVar15]);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          if (iVar13 == 1) {
            Graph::AddEdge(this_00,lVar18,lVar17);
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < this->m_nPoints);
  }
  if (0.0 <= this->m_ccConnectDist) {
    Graph::ExtractCCs(this_00);
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)local_438,"nCC %lu\n",(this->m_graph).m_nCCs);
      (*this->m_callBack)((char *)local_438,0.0,0.0,(this->m_graph).m_nV);
    }
    uVar14 = (this->m_graph).m_nCCs;
    if (1 < uVar14) {
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438[0].
      super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::resize(local_438,uVar14);
      if (this->m_nTriangles != 0) {
        lVar17 = 8;
        lVar18 = 0;
        uVar14 = 0;
        do {
          lVar9 = *(long *)((long)(((this->m_graph).m_vertices.
                                    super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                           lVar17 + -0x10);
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar18));
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar18 + 8));
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_438[0].
                         super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                     (long *)((long)this->m_triangles->m_data + lVar18 + 0x10));
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + 0x18;
          lVar17 = lVar17 + 0x310;
        } while (uVar14 < this->m_nTriangles);
      }
      if ((this->m_graph).m_nCCs != 0) {
        uVar14 = 0;
        do {
          uVar3 = uVar14 + 1;
          if (uVar3 < (this->m_graph).m_nCCs) {
            local_498 = uVar14 * 0x30;
            local_4d0 = uVar3;
            do {
              local_488 = (_Rb_tree_node_base *)
                          ((long)&((local_438[0].
                                    super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                  super__Rb_tree_header._M_header._M_color + local_498);
              p_Var10 = local_488->_M_left;
              if (p_Var10 != local_488) {
                local_490 = local_4d0 * 0x30;
                do {
                  p_Var8 = (_Rb_tree_node_base *)
                           ((long)&((local_438[0].
                                     super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                   super__Rb_tree_header._M_header._M_color + local_490);
                  p_Var12 = p_Var8->_M_left;
                  if (p_Var12 == p_Var8) {
                    local_4d8 = -1;
                    lVar18 = -1;
                    local_4e0 = 1.79769313486232e+308;
                  }
                  else {
                    lVar18 = -1;
                    local_4e0 = 1.79769313486232e+308;
                    local_4d8 = -1;
                    do {
                      lVar17 = *(long *)(p_Var10 + 1);
                      lVar9 = *(long *)(p_Var12 + 1);
                      pVVar6 = this->m_points;
                      dVar7 = pVVar6[lVar17].m_data[1] - pVVar6[lVar9].m_data[1];
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ = dVar7 * dVar7;
                      auVar23._8_8_ = 0;
                      auVar23._0_8_ = pVVar6[lVar17].m_data[0] - pVVar6[lVar9].m_data[0];
                      auVar19 = vfmadd231sd_fma(auVar19,auVar23,auVar23);
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = pVVar6[lVar17].m_data[2] - pVVar6[lVar9].m_data[2];
                      auVar19 = vfmadd231sd_fma(auVar19,auVar22,auVar22);
                      if (auVar19._0_8_ < 0.0) {
                        auVar21._0_8_ = sqrt(auVar19._0_8_);
                        auVar21._8_56_ = extraout_var;
                        auVar20 = auVar21._0_16_;
                      }
                      else {
                        auVar20 = vsqrtsd_avx(auVar19,auVar19);
                      }
                      lVar17 = local_4d8;
                      dVar7 = local_480;
                      if (auVar20._0_8_ < local_4e0) {
                        lVar18 = *(long *)(local_4b8.
                                           super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [*(long *)(p_Var10 + 1)]._M_t._M_impl.
                                           super__Rb_tree_header._M_header._M_left + 1);
                        p_Var1 = &local_4b8.
                                  super__Vector_base<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var12 + 1)].
                                  _M_t._M_impl.super__Rb_tree_header;
                        p_Var11 = (p_Var1->_M_header)._M_left;
                        local_4d8 = -1;
                        local_480 = auVar20._0_8_;
                        while (local_4e0 = local_480, lVar17 = local_4d8,
                              (_Rb_tree_header *)p_Var11 != p_Var1) {
                          local_4e0 = auVar20._0_8_;
                          lVar17 = *(long *)(p_Var11 + 1);
                          dVar7 = local_480;
                          if (*(long *)(p_Var11 + 1) != lVar18) break;
                          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                          auVar20._8_8_ = 0;
                          auVar20._0_8_ = local_480;
                          dVar7 = local_480;
                        }
                      }
                      local_480 = dVar7;
                      local_4d8 = lVar17;
                      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                    } while (p_Var12 != p_Var8);
                  }
                  if (((local_4e0 <= this->m_ccConnectDist) && (-1 < lVar18)) && (-1 < local_4d8)) {
                    Graph::AddEdge(this_00,lVar18,local_4d8);
                  }
                  p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
                } while (p_Var10 != local_488);
              }
              local_4d0 = local_4d0 + 1;
            } while (local_4d0 < (this->m_graph).m_nCCs);
          }
          uVar14 = uVar3;
        } while (uVar3 < (this->m_graph).m_nCCs);
      }
      std::
      vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
      ::~vector(local_438);
    }
  }
  std::
  vector<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::allocator<std::set<long,_std::less<long>,_std::allocator<long>_>_>_>
  ::~vector(&local_4b8);
  return;
}

Assistant:

void HACD::CreateGraph()
    {
		// vertex to triangle adjacency information
		std::vector< std::set<long> >  vertexToTriangles;		
		vertexToTriangles.resize(m_nPoints);
		for(size_t t = 0; t < m_nTriangles; ++t)
		{
			vertexToTriangles[m_triangles[t].X()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Y()].insert(static_cast<long>(t));
			vertexToTriangles[m_triangles[t].Z()].insert(static_cast<long>(t));
		}

		m_graph.Clear();
		m_graph.Allocate(m_nTriangles, 5 * m_nTriangles);
		unsigned long long tr1[3];
		unsigned long long tr2[3];
        long i1, j1, k1, i2, j2, k2;
        long t1, t2;
        for (size_t v = 0; v < m_nPoints; v++) 
		{
			std::set<long>::const_iterator it1(vertexToTriangles[v].begin()), itEnd(vertexToTriangles[v].end()); 
			for(; it1 != itEnd; ++it1)
			{
                t1 = *it1;
                i1 = m_triangles[t1].X();
                j1 = m_triangles[t1].Y();
                k1 = m_triangles[t1].Z();
				tr1[0] = GetEdgeIndex(i1, j1);
				tr1[1] = GetEdgeIndex(j1, k1);
				tr1[2] = GetEdgeIndex(k1, i1);
				std::set<long>::const_iterator it2(it1);
				for(++it2; it2 != itEnd; ++it2)
				{
                    t2 = *it2;
                    i2 = m_triangles[t2].X();
                    j2 = m_triangles[t2].Y();
                    k2 = m_triangles[t2].Z();
					tr2[0] = GetEdgeIndex(i2, j2);
					tr2[1] = GetEdgeIndex(j2, k2);
					tr2[2] = GetEdgeIndex(k2, i2);
					int shared = 0;
					for(int i = 0; i < 3; ++i)
					{
						for(int j = 0; j < 3; ++j)
						{
							if (tr1[i] == tr2[j])	
							{
								shared++;
							}
						}
					}
					if (shared == 1) // two triangles are connected if they share exactly one edge
					{
						m_graph.AddEdge(t1, t2);
					}
				}
			}
        }
        if (m_ccConnectDist >= 0.0)
        {
            m_graph.ExtractCCs();
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "nCC " SIZET_FMT "\n", m_graph.m_nCCs);
                (*m_callBack)(msg, 0.0, 0.0,  m_graph.GetNVertices());
                
            }
            
            if (m_graph.m_nCCs > 1) 
            {
                std::vector< std::set<long> > cc2V;
                cc2V.resize(m_graph.m_nCCs);
                long cc;
                for(size_t t = 0; t < m_nTriangles; ++t)
                {
                    cc = m_graph.m_vertices[t].m_cc;
                    cc2V[cc].insert(m_triangles[t].X());
                    cc2V[cc].insert(m_triangles[t].Y());
                    cc2V[cc].insert(m_triangles[t].Z());
                }
                
                for(size_t cc1 = 0; cc1 < m_graph.m_nCCs; ++cc1)
                {
                    for(size_t cc2 = cc1+1; cc2 < m_graph.m_nCCs; ++cc2)
                    {
                        std::set<long>::const_iterator itV1(cc2V[cc1].begin()), itVEnd1(cc2V[cc1].end()); 
                        for(; itV1 != itVEnd1; ++itV1)
                        {
							double distC1C2 = std::numeric_limits<double>::max();
                            double dist;
                            t1 = -1;
                            t2 = -1;
                            std::set<long>::const_iterator itV2(cc2V[cc2].begin()), itVEnd2(cc2V[cc2].end()); 
                            for(; itV2 != itVEnd2; ++itV2)
                            {
                                dist = (m_points[*itV1] - m_points[*itV2]).GetNorm();
                                if (dist < distC1C2)
                                {
                                    distC1C2 = dist;
                                    t1 = *vertexToTriangles[*itV1].begin();
                                    
									std::set<long>::const_iterator it2(vertexToTriangles[*itV2].begin()), 
																   it2End(vertexToTriangles[*itV2].end()); 
									t2 = -1;
									for(; it2 != it2End; ++it2)
									{
										if (*it2 != t1)
										{
											t2 = *it2;
											break;
										}
									}
                                }
                            }
                            if (distC1C2 <= m_ccConnectDist && t1 >= 0 && t2 >= 0)
                            {
                                m_graph.AddEdge(t1, t2);                    
                            }
                        }
                    }
                }
            }
        }
    }